

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool CountLowbitsCollisions<Blob<160>>
               (vector<Blob<160>,_std::allocator<Blob<160>_>_> *revhashes,int nbLBits)

{
  bool bVar1;
  size_type sVar2;
  uint in_ESI;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_RDI;
  double dVar3;
  Blob<160> h2;
  Blob<160> h1;
  size_t hnb;
  int collcount;
  double expected;
  size_t nbH;
  int shiftBy;
  int origBits;
  int in_stack_ffffffffffffffa4;
  Blob<160> *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  ulong local_40;
  uint local_34;
  bool local_1;
  
  if ((int)(0xa0 - in_ESI) < 1) {
    local_1 = true;
  }
  else {
    sVar2 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::size(in_RDI);
    dVar3 = EstimateNbCollisions(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    printf("Testing collisions (low  %2i-bit) - Expected %12.1f, ",dVar3,(ulong)in_ESI);
    local_34 = 0;
    for (local_40 = 1; local_40 < sVar2; local_40 = local_40 + 1) {
      std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::operator[](in_RDI,local_40 - 1);
      Blob<160>::operator>>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::operator[](in_RDI,local_40);
      Blob<160>::operator>>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      bVar1 = Blob<160>::operator==
                        ((Blob<160> *)&stack0xffffffffffffffac,(Blob<160> *)&stack0xffffffffffffff98
                        );
      if (bVar1) {
        local_34 = local_34 + 1;
      }
    }
    printf("actual %6i (%.2fx)",(double)(int)local_34 / dVar3,(ulong)local_34);
    if ((0.98 < (double)(int)local_34 / dVar3) && (local_34 != (int)dVar3)) {
      printf(" (%i)",(ulong)(local_34 - (int)dVar3));
    }
    if ((double)(int)local_34 / dVar3 <= 2.0) {
      printf("\n");
      local_1 = true;
    }
    else {
      printf(" !!!!!\n");
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CountLowbitsCollisions ( std::vector<hashtype> & revhashes, int nbLBits)
{
  const int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbLBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = revhashes.size();
  double expected = EstimateNbCollisions(nbH, nbLBits);
  printf("Testing collisions (low  %2i-bit) - Expected %12.1f, ", nbLBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
#ifdef DEBUG
    hashtype const h1x = revhashes[hnb-1];
    hashtype const h2x = revhashes[hnb];
#endif
    hashtype const h1 = revhashes[hnb-1] >> shiftBy;
    hashtype const h2 = revhashes[hnb]   >> shiftBy;
    if(h1 == h2)
      collcount++;
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}